

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O2

void destroy2Dfield(void **field,int sizeX)

{
  ulong uVar1;
  ulong uVar2;
  
  if (field != (void **)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)sizeX;
    if (sizeX < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      free(field[uVar2]);
    }
    free(field);
    return;
  }
  return;
}

Assistant:

void destroy2Dfield (void** field, int sizeX)
{
	if (field == NULL)
		return;
	for (int i = 0; i < sizeX; i++)
	{
		destroy1Dfield((void*)field[i]);
	}
	free(field);
	return;
}